

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O2

qreal __thiscall QLineF::angleTo(QLineF *this,QLineF *l)

{
  bool bVar1;
  qreal qVar2;
  qreal qVar3;
  double p1;
  
  bVar1 = isNull(this);
  qVar2 = 0.0;
  if (!bVar1) {
    bVar1 = isNull(l);
    if (bVar1) {
      qVar2 = 0.0;
    }
    else {
      qVar2 = angle(this);
      qVar3 = angle(l);
      p1 = qVar3 - qVar2;
      bVar1 = qFuzzyCompare(p1,360.0);
      qVar2 = 0.0;
      if (!bVar1) {
        qVar2 = (qreal)(~-(ulong)(p1 < 0.0) & (ulong)p1 | (ulong)(p1 + 360.0) & -(ulong)(p1 < 0.0));
      }
    }
  }
  return qVar2;
}

Assistant:

qreal QLineF::angleTo(const QLineF &l) const
{
    if (isNull() || l.isNull())
        return 0;

    const qreal a1 = angle();
    const qreal a2 = l.angle();

    const qreal delta = a2 - a1;
    const qreal delta_normalized = delta < 0 ? delta + 360 : delta;

    if (qFuzzyCompare(delta, qreal(360)))
        return 0;
    else
        return delta_normalized;
}